

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderApiTests.cpp
# Opt level: O0

string * __thiscall
deqp::gles3::Functional::(anonymous_namespace)::ConstantShaderGenerator::next_abi_cxx11_
          (string *__return_storage_ptr__,void *this,ShaderType shaderType)

{
  ostream *poVar1;
  char *local_208;
  ostringstream local_1f0 [8];
  ostringstream out;
  allocator<char> local_61;
  string local_60 [8];
  string outputName;
  string valueString;
  float value;
  ShaderType shaderType_local;
  ConstantShaderGenerator *this_local;
  
  valueString.field_2._12_4_ = shaderType;
  valueString.field_2._8_4_ = de::Random::getFloat((Random *)((long)this + 8),0.0,1.0);
  de::toString<float>((string *)((long)&outputName.field_2 + 8),
                      (float *)((long)&valueString.field_2 + 8));
  if (valueString.field_2._12_4_ == 0) {
    local_208 = "gl_Position";
  }
  else {
    local_208 = "o_fragColor";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_60,local_208,&local_61);
  std::allocator<char>::~allocator(&local_61);
  std::__cxx11::ostringstream::ostringstream(local_1f0);
  std::operator<<((ostream *)local_1f0,"#version 300 es\n");
  if (valueString.field_2._12_4_ == 1) {
    std::operator<<((ostream *)local_1f0,"layout(location = 0) out mediump vec4 o_fragColor;\n");
  }
  std::operator<<((ostream *)local_1f0,"void main (void)\n");
  std::operator<<((ostream *)local_1f0,"{\n");
  poVar1 = std::operator<<((ostream *)local_1f0,"\t");
  poVar1 = std::operator<<(poVar1,local_60);
  poVar1 = std::operator<<(poVar1," = vec4(");
  poVar1 = std::operator<<(poVar1,(string *)(outputName.field_2._M_local_buf + 8));
  std::operator<<(poVar1,");\n");
  std::operator<<((ostream *)local_1f0,"}\n");
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_1f0);
  std::__cxx11::string::~string(local_60);
  std::__cxx11::string::~string((string *)(outputName.field_2._M_local_buf + 8));
  return __return_storage_ptr__;
}

Assistant:

std::string ConstantShaderGenerator::next (const glu::ShaderType shaderType)
{
	DE_ASSERT(shaderType == glu::SHADERTYPE_VERTEX || shaderType == glu::SHADERTYPE_FRAGMENT);

	const float			value		= m_rnd.getFloat(0.0f, 1.0f);
	const std::string	valueString	= de::toString(value);
	const std::string	outputName	= (shaderType == glu::SHADERTYPE_VERTEX) ? "gl_Position" : "o_fragColor";

	std::ostringstream	out;

	out << "#version 300 es\n";

	if (shaderType == glu::SHADERTYPE_FRAGMENT)
		out << "layout(location = 0) out mediump vec4 o_fragColor;\n";

	out << "void main (void)\n";
	out << "{\n";
	out << "	" << outputName << " = vec4(" << valueString << ");\n";
	out << "}\n";

	return out.str();
}